

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O3

int image_oprom_get_version(igsc_oprom_image *img,igsc_oprom_type type,igsc_oprom_version *version)

{
  bool bVar1;
  igsc_oprom_type iVar2;
  igsc_oprom_type iVar3;
  int iVar4;
  igsc_oprom_version *piVar5;
  
  if (img->data_part_ptr == (uint8_t *)0x0) {
    iVar2 = IGSC_OPROM_NONE;
  }
  else {
    iVar2 = (igsc_oprom_type)(img->data_part_len != 0);
  }
  if ((img->code_part_ptr == (uint8_t *)0x0) || (img->code_part_len == 0)) {
    iVar3 = IGSC_OPROM_DATA;
    if (iVar2 == IGSC_OPROM_NONE) {
      return 5;
    }
  }
  else {
    iVar3 = iVar2 | IGSC_OPROM_CODE;
  }
  if ((iVar3 & type) == IGSC_OPROM_NONE) {
    return 9;
  }
  if (type == IGSC_OPROM_CODE) {
    iVar4 = 0;
    if (version != (igsc_oprom_version *)0x0) {
      piVar5 = &img->code_version;
      bVar1 = version + 1 <= piVar5;
      if (piVar5 < version) {
        bVar1 = (img->code_version).version + 7 < version;
      }
      if (bVar1) goto LAB_0011a506;
    }
  }
  else {
    iVar4 = 3;
    if ((type == IGSC_OPROM_DATA) && (iVar4 = 0, version != (igsc_oprom_version *)0x0)) {
      piVar5 = &img->data_version;
      bVar1 = version + 1 <= piVar5;
      if (piVar5 < version) {
        bVar1 = (img->data_version).version + 7 < version;
      }
      if (bVar1) {
LAB_0011a506:
        *(undefined8 *)version->version = *(undefined8 *)piVar5->version;
        return 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int image_oprom_get_version(struct igsc_oprom_image *img,
                            enum igsc_oprom_type type,
                            struct igsc_oprom_version *version)
{
    enum igsc_oprom_type img_type;

    img_type = image_oprom_get_type(img);
    if (img_type == IGSC_OPROM_NONE)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    if ((img_type & type) == 0)
    {
        return IGSC_ERROR_NOT_SUPPORTED;
    }

    if (type == IGSC_OPROM_DATA)
    {
        gsc_memcpy_s(version, sizeof(*version),
                     &img->data_version,  sizeof(*version));
        return IGSC_SUCCESS;
    }
    else if (type == IGSC_OPROM_CODE)
    {
        gsc_memcpy_s(version, sizeof(*version),
                     &img->code_version,  sizeof(*version));
        return IGSC_SUCCESS;
    }

    return IGSC_ERROR_INVALID_PARAMETER;
}